

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osal.c
# Opt level: O3

void osal_timer_start(osal_timert *self,uint32 timeout_usec)

{
  uint32 uVar1;
  long lVar2;
  timespec ts;
  timespec local_28;
  
  clock_gettime(1,&local_28);
  lVar2 = (ulong)(timeout_usec % 1000000) + local_28.tv_nsec / 1000;
  uVar1 = (uint32)lVar2 - 1000000;
  if (lVar2 < 1000000) {
    uVar1 = (uint32)lVar2;
  }
  (self->stop_time).sec = (uint)(999999 < lVar2) + timeout_usec / 1000000 + (int)local_28.tv_sec;
  (self->stop_time).usec = uVar1;
  return;
}

Assistant:

void osal_timer_start (osal_timert * self, uint32 timeout_usec)
{
   struct timeval start_time;
   struct timeval timeout;
   struct timeval stop_time;

   osal_gettimeofday (&start_time, 0);
   timeout.tv_sec = timeout_usec / USECS_PER_SEC;
   timeout.tv_usec = timeout_usec % USECS_PER_SEC;
   timeradd (&start_time, &timeout, &stop_time);

   self->stop_time.sec = stop_time.tv_sec;
   self->stop_time.usec = stop_time.tv_usec;
}